

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeDeepTiledFile.cpp
# Opt level: O0

void writeDeepTiledFile(char *filename,Box2i *displayWindow,Box2i *dataWindow,int tileSizeX,
                       int tileSizeY)

{
  int iVar1;
  char *pcVar2;
  undefined4 *puVar3;
  uint *puVar4;
  float **ppfVar5;
  half **pphVar6;
  uint in_ECX;
  int *in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  uint in_R8D;
  int j_1;
  int i_1;
  int i;
  int j;
  DeepFrameBuffer frameBuffer;
  DeepTiledOutputFile file;
  Array2D<unsigned_int> sampleCount;
  Array2D<Imath_3_2::half_*> dataA;
  Array2D<float_*> dataZ;
  Header header;
  int width;
  int height;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffd34;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  long in_stack_fffffffffffffd48;
  DeepFrameBuffer *in_stack_fffffffffffffd50;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  DeepSlice local_210 [56];
  DeepSlice local_1d8 [56];
  Slice local_1a0 [56];
  Slice local_168 [104];
  undefined1 local_100 [40];
  Array2D<Imath_3_2::half_*> local_d8;
  Array2D<float_*> local_c0;
  TileDescription local_a4;
  Channel local_94 [16];
  Channel local_84 [28];
  Vec2<float> local_68;
  TileDescription local_60 [3];
  int local_28;
  int local_24;
  uint local_20;
  uint local_1c;
  char *local_8;
  
  local_24 = (in_RDX[3] - in_RDX[1]) + 1;
  local_28 = (in_RDX[2] - *in_RDX) + 1;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_8 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(&local_68,0.0,0.0);
  Imf_3_4::Header::Header((Header *)0x3f800000,local_60,in_RSI,in_RDX,&local_68,0,3);
  pcVar2 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_84,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar2,(Channel *)0x1100cc);
  pcVar2 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_94,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar2,(Channel *)0x1100d2);
  Imf_3_4::Header::setType((string *)local_60);
  puVar3 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar3 = 2;
  Imf_3_4::TileDescription::TileDescription(&local_a4,local_1c,local_20,ONE_LEVEL,ROUND_DOWN);
  Imf_3_4::Header::setTileDescription(local_60);
  Imf_3_4::Array2D<float_*>::Array2D(&local_c0);
  Imf_3_4::Array2D<float_*>::resizeErase
            ((Array2D<float_*> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  Imf_3_4::Array2D<Imath_3_2::half_*>::Array2D(&local_d8);
  Imf_3_4::Array2D<Imath_3_2::half_*>::resizeErase
            ((Array2D<Imath_3_2::half_*> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  Imf_3_4::Array2D<unsigned_int>::Array2D((Array2D<unsigned_int> *)(local_100 + 0x10));
  Imf_3_4::Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepTiledOutputFile::DeepTiledOutputFile
            ((DeepTiledOutputFile *)local_100,local_8,(Header *)local_60,iVar1);
  Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffffd50);
  puVar4 = Imf_3_4::Array2D<unsigned_int>::operator[]((Array2D<unsigned_int> *)(local_100 + 0x10),0)
  ;
  Imf_3_4::Slice::Slice
            (local_1a0,UINT,(char *)(puVar4 + (-(long)*in_RDX - (long)(in_RDX[1] * local_28))),4,
             (long)local_28 << 2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(local_168);
  ppfVar5 = Imf_3_4::Array2D<float_*>::operator[](&local_c0,0);
  Imf_3_4::DeepSlice::DeepSlice
            (local_1d8,FLOAT,(char *)(ppfVar5 + (-(long)*in_RDX - (long)(in_RDX[1] * local_28))),8,
             (long)local_28 << 3,4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)local_168,(DeepSlice *)0x1100cc);
  pphVar6 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[](&local_d8,0);
  uVar7 = 1;
  Imf_3_4::DeepSlice::DeepSlice
            (local_210,HALF,(char *)(pphVar6 + (-(long)*in_RDX - (long)(in_RDX[1] * local_28))),8,
             (long)local_28 << 3,2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)local_168,(DeepSlice *)0x1100d2);
  Imf_3_4::DeepTiledOutputFile::setFrameBuffer((DeepFrameBuffer *)local_100);
  local_214 = 0;
  while( true ) {
    iVar1 = Imf_3_4::DeepTiledOutputFile::numYTiles((int)local_100);
    if (iVar1 <= local_214) break;
    local_218 = 0;
    while( true ) {
      iVar1 = Imf_3_4::DeepTiledOutputFile::numXTiles((int)local_100);
      if (iVar1 <= local_218) break;
      getSampleDataForTile
                (local_218,local_214,local_1c,local_20,(Array2D<unsigned_int> *)(local_100 + 0x10),
                 &local_c0,&local_d8);
      Imf_3_4::DeepTiledOutputFile::writeTile((int)local_100,local_218,local_214);
      local_218 = local_218 + 1;
    }
    local_214 = local_214 + 1;
  }
  for (local_21c = 0; local_21c < local_24; local_21c = local_21c + 1) {
    for (local_220 = 0; local_220 < local_28; local_220 = local_220 + 1) {
      ppfVar5 = Imf_3_4::Array2D<float_*>::operator[](&local_c0,(long)local_21c);
      if (ppfVar5[local_220] != (float *)0x0) {
        operator_delete__(ppfVar5[local_220]);
      }
      pphVar6 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[](&local_d8,(long)local_21c);
      if (pphVar6[local_220] != (half *)0x0) {
        operator_delete__(pphVar6[local_220]);
      }
    }
  }
  Imf_3_4::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x10ab31);
  Imf_3_4::DeepTiledOutputFile::~DeepTiledOutputFile((DeepTiledOutputFile *)local_100);
  Imf_3_4::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffd34,uVar7));
  Imf_3_4::Array2D<Imath_3_2::half_*>::~Array2D
            ((Array2D<Imath_3_2::half_*> *)CONCAT44(in_stack_fffffffffffffd34,uVar7));
  Imf_3_4::Array2D<float_*>::~Array2D((Array2D<float_*> *)CONCAT44(in_stack_fffffffffffffd34,uVar7))
  ;
  Imf_3_4::Header::~Header((Header *)local_60);
  return;
}

Assistant:

void
writeDeepTiledFile (
    const char filename[],
    Box2i      displayWindow,
    Box2i      dataWindow,
    int        tileSizeX,
    int        tileSizeY)
{
    int height = dataWindow.max.y - dataWindow.min.y + 1;
    int width  = dataWindow.max.x - dataWindow.min.x + 1;

    Header header (displayWindow, dataWindow);
    header.channels ().insert ("Z", Channel (FLOAT));
    header.channels ().insert ("A", Channel (HALF));
    header.setType (DEEPTILE);
    header.compression () = ZIPS_COMPRESSION;

    header.setTileDescription (
        TileDescription (tileSizeX, tileSizeY, ONE_LEVEL));

    Array2D<float*> dataZ;
    dataZ.resizeErase (height, width);

    Array2D<half*> dataA;
    dataA.resizeErase (height, width);

    Array2D<unsigned int> sampleCount;
    sampleCount.resizeErase (height, width);

    DeepTiledOutputFile file (filename, header);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        UINT,
        (char*) (&sampleCount[0][0] - dataWindow.min.x - dataWindow.min.y * width),
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    frameBuffer.insert (
        "Z",
        DeepSlice (
            FLOAT,
            (char*) (&dataZ[0][0] - dataWindow.min.x - dataWindow.min.y * width),
            sizeof (float*) * 1,     // xStride for pointer array
            sizeof (float*) * width, // yStride for pointer array
            sizeof (float) * 1));    // stride for samples

    frameBuffer.insert (
        "A",
        DeepSlice (
            HALF,
            (char*) (&dataA[0][0] - dataWindow.min.x - dataWindow.min.y * width),
            sizeof (half*) * 1,     // xStride for pointer array
            sizeof (half*) * width, // yStride for pointer array
            sizeof (half) * 1));    // stride for samples

    file.setFrameBuffer (frameBuffer);

    for (int j = 0; j < file.numYTiles (0); j++)
    {
        for (int i = 0; i < file.numXTiles (0); i++)
        {
            // Generate data for sampleCount, dataZ and dataA.
            getSampleDataForTile (i, j, tileSizeX, tileSizeY, sampleCount, dataZ, dataA);
            file.writeTile (i, j, 0);
        }
    }
    
    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            delete[] dataZ[i][j];
            delete[] dataA[i][j];
        }
    }
}